

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int result;
  int64_t sizes [1000];
  int i;
  uint in_stack_ffffffffffffe0ac;
  undefined4 in_stack_ffffffffffffe0b0;
  undefined4 in_stack_ffffffffffffe0b4;
  long local_1f48 [17];
  int in_stack_ffffffffffffe140;
  int in_stack_ffffffffffffe144;
  int64_t *in_stack_ffffffffffffe148;
  undefined8 local_10;
  int local_8;
  
  srand48(0x2a);
  fill_random((int64_t *)CONCAT44(in_stack_ffffffffffffe0b4,in_stack_ffffffffffffe0b0),
              in_stack_ffffffffffffe0ac);
  for (local_8 = 0; local_8 < 1000; local_8 = local_8 + 1) {
    local_1f48[local_8] = (long)(((double)local_1f48[local_8] / 2147483648.0) * 42000.0) + 1;
  }
  local_10 = 42000;
  local_8 = 0;
  while( true ) {
    if (0x14 < local_8) {
      return 0;
    }
    iVar1 = run_tests(in_stack_ffffffffffffe148,in_stack_ffffffffffffe144,in_stack_ffffffffffffe140)
    ;
    if (iVar1 != 0) break;
    local_8 = local_8 + 1;
  }
  return 1;
}

Assistant:

int main(void) {
  int i = 0;
  int64_t sizes[TESTS];
  srand48(SEED);
  // stable_tests();
  fill_random(sizes, TESTS);

  for (i = 0; i < TESTS; i++) {
    RAND_RANGE(sizes[i], 1, MAXSIZE);
  }

  sizes[TESTS - 1] = MAXSIZE;

  for (i = 0; i < FILL_LAST_ELEMENT; i++) {
    int result = run_tests(sizes, TESTS, i);

    if (result) {
      return 1;
    }
  }

  return 0;
}